

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O3

CK_VOID_PTR __thiscall HandleManager::getSession(HandleManager *this,CK_SESSION_HANDLE hSession)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  CK_VOID_PTR pvVar3;
  _Rb_tree_header *p_Var4;
  MutexLocker lock;
  MutexLocker local_20;
  
  MutexLocker::MutexLocker(&local_20,this->handlesMutex);
  p_Var2 = (this->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var4 = &(this->handles)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &p_Var4->_M_header;
    do {
      if (*(ulong *)(p_Var2 + 1) >= hSession) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < hSession];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var1 != p_Var4) && (*(ulong *)(p_Var1 + 1) <= hSession)) &&
       (p_Var1[1]._M_parent == (_Base_ptr)0x1)) {
      pvVar3 = *(CK_VOID_PTR *)(p_Var1 + 2);
      goto LAB_00162ed0;
    }
  }
  pvVar3 = (CK_VOID_PTR)0x0;
LAB_00162ed0:
  MutexLocker::~MutexLocker(&local_20);
  return pvVar3;
}

Assistant:

CK_VOID_PTR HandleManager::getSession(const CK_SESSION_HANDLE hSession)
{
	MutexLocker lock(handlesMutex);

	std::map< CK_ULONG, Handle>::iterator it = handles.find(hSession);
	if (it == handles.end() || CKH_SESSION != it->second.kind)
		return NULL_PTR;
	return it->second.object;
}